

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VertexBuffer.cpp
# Opt level: O3

bool __thiscall sf::VertexBuffer::update(VertexBuffer *this,VertexBuffer *vertexBuffer)

{
  GLboolean GVar1;
  GLboolean GVar2;
  void *__dest;
  void *__src;
  GLenum GVar3;
  bool bVar4;
  TransientContextLock contextLock;
  TransientContextLock local_31;
  
  if ((this->m_buffer == 0) || (vertexBuffer->m_buffer == 0)) {
    bVar4 = false;
  }
  else {
    GlResource::TransientContextLock::TransientContextLock(&local_31);
    priv::ensureExtensionsInit();
    if (SF_GLAD_GL_ARB_copy_buffer == 0) {
      (*sf_glad_glBindBufferARB)(0x8892,this->m_buffer);
      GVar3 = 0x88e4;
      if (this->m_usage != Static) {
        GVar3 = (uint)(this->m_usage == Dynamic) * 8 + 0x88e0;
      }
      (*sf_glad_glBufferDataARB)(0x8892,vertexBuffer->m_size * 0x14,(void *)0x0,GVar3);
      __dest = (*sf_glad_glMapBufferARB)(0x8892,0x88b9);
      (*sf_glad_glBindBufferARB)(0x8892,vertexBuffer->m_buffer);
      __src = (*sf_glad_glMapBufferARB)(0x8892,35000);
      memcpy(__dest,__src,vertexBuffer->m_size * 0x14);
      GVar1 = (*sf_glad_glUnmapBufferARB)(0x8892);
      (*sf_glad_glBindBufferARB)(0x8892,this->m_buffer);
      GVar2 = (*sf_glad_glUnmapBufferARB)(0x8892);
      (*sf_glad_glBindBufferARB)(0x8892,0);
      bVar4 = GVar2 != '\0' && GVar1 != '\0';
    }
    else {
      (*sf_glad_glBindBufferARB)(0x8f36,vertexBuffer->m_buffer);
      (*sf_glad_glBindBufferARB)(0x8f37,this->m_buffer);
      (*sf_glad_glCopyBufferSubData)(0x8f36,0x8f37,0,0,vertexBuffer->m_size * 0x14);
      (*sf_glad_glBindBufferARB)(0x8f37,0);
      bVar4 = true;
      (*sf_glad_glBindBufferARB)(0x8f36,0);
    }
    GlResource::TransientContextLock::~TransientContextLock(&local_31);
  }
  return bVar4;
}

Assistant:

bool VertexBuffer::update(const VertexBuffer& vertexBuffer)
{
#ifdef SFML_OPENGL_ES

    (void) vertexBuffer;
    return false;

#else

    if (!m_buffer || !vertexBuffer.m_buffer)
        return false;

    TransientContextLock contextLock;

    // Make sure that extensions are initialized
    sf::priv::ensureExtensionsInit();

    if (GLEXT_copy_buffer)
    {
        glCheck(GLEXT_glBindBuffer(GLEXT_GL_COPY_READ_BUFFER, vertexBuffer.m_buffer));
        glCheck(GLEXT_glBindBuffer(GLEXT_GL_COPY_WRITE_BUFFER, m_buffer));

        glCheck(GLEXT_glCopyBufferSubData(GLEXT_GL_COPY_READ_BUFFER, GLEXT_GL_COPY_WRITE_BUFFER, 0, 0, static_cast<GLsizeiptr>(sizeof(Vertex) * vertexBuffer.m_size)));

        glCheck(GLEXT_glBindBuffer(GLEXT_GL_COPY_WRITE_BUFFER, 0));
        glCheck(GLEXT_glBindBuffer(GLEXT_GL_COPY_READ_BUFFER, 0));

        return true;
    }

    glCheck(GLEXT_glBindBuffer(GLEXT_GL_ARRAY_BUFFER, m_buffer));
    glCheck(GLEXT_glBufferData(GLEXT_GL_ARRAY_BUFFER, static_cast<GLsizeiptrARB>(sizeof(Vertex) * vertexBuffer.m_size), 0, VertexBufferImpl::usageToGlEnum(m_usage)));

    void* destination = 0;
    glCheck(destination = GLEXT_glMapBuffer(GLEXT_GL_ARRAY_BUFFER, GLEXT_GL_WRITE_ONLY));

    glCheck(GLEXT_glBindBuffer(GLEXT_GL_ARRAY_BUFFER, vertexBuffer.m_buffer));

    void* source = 0;
    glCheck(source = GLEXT_glMapBuffer(GLEXT_GL_ARRAY_BUFFER, GLEXT_GL_READ_ONLY));

    std::memcpy(destination, source, sizeof(Vertex) * vertexBuffer.m_size);

    GLboolean sourceResult = GL_FALSE;
    glCheck(sourceResult = GLEXT_glUnmapBuffer(GLEXT_GL_ARRAY_BUFFER));

    glCheck(GLEXT_glBindBuffer(GLEXT_GL_ARRAY_BUFFER, m_buffer));

    GLboolean destinationResult = GL_FALSE;
    glCheck(destinationResult = GLEXT_glUnmapBuffer(GLEXT_GL_ARRAY_BUFFER));

    glCheck(GLEXT_glBindBuffer(GLEXT_GL_ARRAY_BUFFER, 0));

    if ((sourceResult == GL_FALSE) || (destinationResult == GL_FALSE))
        return false;

    return true;

#endif // SFML_OPENGL_ES
}